

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderBasicData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderBasicData::Encode
          (Mode5TransponderBasicData *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Mode5TransponderBasicData *this_local;
  
  pKVar1 = DATA_TYPE::operator<<(stream,&(this->m_Status).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16PIN);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui32MsgFormats);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_EM1Code);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16NationalOrigin);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_SupplementalData).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8NavSrc);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8FigMerit);
  KDataStream::operator<<(pKVar1,this->m_ui8Padding);
  return;
}

Assistant:

void Mode5TransponderBasicData::Encode( KDataStream & stream ) const
{
    stream << KDIS_STREAM m_Status
           << m_ui16PIN
           << m_ui32MsgFormats
           << KDIS_STREAM m_EM1Code
           << m_ui16NationalOrigin
           << KDIS_STREAM m_SupplementalData
           << m_ui8NavSrc
           << m_ui8FigMerit
           << m_ui8Padding;

}